

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalGraph.cpp
# Opt level: O1

void __thiscall wasm::LocalGraphFlower::prepareLaziness(LocalGraphFlower *this)

{
  size_t __new_size;
  pointer ppEVar1;
  mapped_type *pmVar2;
  ulong uVar3;
  LocalSet *pLVar4;
  iterator __position;
  vector<wasm::LocalGet*,std::allocator<wasm::LocalGet*>> *this_00;
  FlowBlock *block;
  FlowBlock *pFVar5;
  uint uVar6;
  LocalSet *local_60;
  LocalSet *set;
  vector<std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>,_std::allocator<std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>_>
  *local_50;
  FlowBlock *local_48;
  LocalSet *local_40;
  LocalGet *get;
  
  prepareFlowBlocks(this);
  __new_size = Function::getNumLocals(this->func);
  set = (LocalSet *)&this->getsByIndex;
  std::
  vector<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>,_std::allocator<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>
  ::resize((vector<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>,_std::allocator<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>
            *)set,__new_size);
  local_50 = &this->setsByIndex;
  std::
  vector<std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>,_std::allocator<std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>_>
  ::resize(local_50,__new_size);
  pFVar5 = (this->flowBlocks).
           super__Vector_base<wasm::LocalGraphFlower::FlowBlock,_std::allocator<wasm::LocalGraphFlower::FlowBlock>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_48 = (this->flowBlocks).
             super__Vector_base<wasm::LocalGraphFlower::FlowBlock,_std::allocator<wasm::LocalGraphFlower::FlowBlock>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (pFVar5 != local_48) {
    get = (LocalGet *)&this->getLocations;
    do {
      ppEVar1 = (pFVar5->actions).
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((pFVar5->actions).
          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppEVar1) {
        uVar6 = 1;
        uVar3 = 0;
        do {
          pLVar4 = (LocalSet *)ppEVar1[uVar3];
          if ((((SpecificExpression<(wasm::Expression::Id)8> *)
               &((LocalSet *)ppEVar1[uVar3])->super_SpecificExpression<(wasm::Expression::Id)9>)->
              super_Expression)._id != LocalGetId) {
            pLVar4 = (LocalSet *)0x0;
          }
          if (pLVar4 == (LocalSet *)0x0) {
            local_40 = (LocalSet *)ppEVar1[uVar3];
            if ((((SpecificExpression<(wasm::Expression::Id)8> *)
                 &((LocalSet *)ppEVar1[uVar3])->super_SpecificExpression<(wasm::Expression::Id)9>)->
                super_Expression)._id != LocalSetId) {
              local_40 = (LocalSet *)0x0;
            }
            local_60 = local_40;
            if (local_40 != (LocalSet *)0x0) {
              this_00 = (vector<wasm::LocalGet*,std::allocator<wasm::LocalGet*>> *)
                        ((local_50->
                         super__Vector_base<std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>,_std::allocator<std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + local_40->index);
              __position._M_current =
                   *(LocalSet ***)
                    ((vector<wasm::LocalSet*,std::allocator<wasm::LocalSet*>> *)this_00 + 8);
              if (__position._M_current !=
                  *(LocalSet ***)
                   ((vector<wasm::LocalSet*,std::allocator<wasm::LocalSet*>> *)this_00 + 0x10))
              goto LAB_0071b912;
              local_40 = pLVar4;
              std::vector<wasm::LocalSet*,std::allocator<wasm::LocalSet*>>::
              _M_realloc_insert<wasm::LocalSet*const&>
                        ((vector<wasm::LocalSet*,std::allocator<wasm::LocalSet*>> *)this_00,
                         __position,&local_60);
            }
          }
          else {
            local_40 = pLVar4;
            pmVar2 = std::__detail::
                     _Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)get,(key_type *)&local_40);
            pmVar2->first = pFVar5;
            pmVar2->second = uVar6 - 1;
            this_00 = (vector<wasm::LocalGet*,std::allocator<wasm::LocalGet*>> *)
                      (*(long *)&(set->super_SpecificExpression<(wasm::Expression::Id)9>).
                                 super_Expression + (ulong)local_40->index * 0x18);
            __position._M_current = *(LocalSet ***)(this_00 + 8);
            if (__position._M_current == (LocalSet **)*(LocalGet ***)(this_00 + 0x10)) {
              std::vector<wasm::LocalGet*,std::allocator<wasm::LocalGet*>>::
              _M_realloc_insert<wasm::LocalGet*const&>
                        (this_00,(iterator)__position._M_current,(LocalGet **)&local_40);
            }
            else {
LAB_0071b912:
              *__position._M_current = local_40;
              *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
            }
          }
          uVar3 = (ulong)uVar6;
          ppEVar1 = (pFVar5->actions).
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar6 = uVar6 + 1;
        } while (uVar3 < (ulong)((long)(pFVar5->actions).
                                       super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar1 >>
                                3));
      }
      pFVar5 = pFVar5 + 1;
    } while (pFVar5 != local_48);
  }
  return;
}

Assistant:

void prepareLaziness() {
    prepareFlowBlocks();

    // Set up getLocations, getsByIndex, and setsByIndex.
    auto numLocals = func->getNumLocals();
    getsByIndex.resize(numLocals);
    setsByIndex.resize(numLocals);

    for (auto& block : flowBlocks) {
      const auto& actions = block.actions;
      for (Index i = 0; i < actions.size(); i++) {
        if (auto* get = actions[i]->dynCast<LocalGet>()) {
          getLocations[get] = BlockLocation{&block, i};
          getsByIndex[get->index].push_back(get);
        } else if (auto* set = actions[i]->dynCast<LocalSet>()) {
          setsByIndex[set->index].push_back(set);
        }
      }
    }
  }